

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O0

void __thiscall Liby::PollerPoll::loop_once(PollerPoll *this,Timestamp *ts)

{
  ushort uVar1;
  int fd_00;
  _Invoker_type p_Var2;
  bool bVar3;
  uint64_t uVar4;
  reference pvVar5;
  size_type __nfds;
  _Invoker_type p_Var6;
  Channel *pCVar7;
  Channel *ch;
  int revent;
  int fd;
  bool flag;
  anon_class_8_1_8991fb9c local_98;
  function<void_()> local_90;
  undefined1 local_70 [8];
  DeferCaller deferCaller;
  size_type i;
  undefined1 local_40 [4];
  int nready;
  undefined1 local_30 [8];
  Timestamp now;
  int interMs;
  Timestamp *ts_local;
  PollerPoll *this_local;
  
  Poller::runNextLoopHandlers(&this->super_Poller);
  now.tv_.tv_usec._4_4_ = -1;
  if (ts != (Timestamp *)0x0) {
    Timestamp::now();
    bVar3 = operator<(ts,(Timestamp *)local_30);
    if (bVar3) {
      now.tv_.tv_usec._4_4_ = 0;
    }
    else {
      operator-((Liby *)local_40,ts,(Timestamp *)local_30);
      uVar4 = Timestamp::toMillSec((Timestamp *)local_40);
      now.tv_.tv_usec._4_4_ = (int)uVar4;
    }
  }
  pvVar5 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->pollfds_,0);
  __nfds = std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->pollfds_);
  i._4_4_ = poll((pollfd *)pvVar5,__nfds,now.tv_.tv_usec._4_4_);
  for (deferCaller.functor_._M_invoker = (_Invoker_type)0x0;
      p_Var2 = deferCaller.functor_._M_invoker,
      p_Var6 = (_Invoker_type)std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->pollfds_),
      p_Var2 < p_Var6 && 0 < i._4_4_;
      deferCaller.functor_._M_invoker = deferCaller.functor_._M_invoker + 1) {
    local_98.this = this;
    std::function<void()>::function<Liby::PollerPoll::loop_once(Liby::Timestamp*)::__0,void>
              ((function<void()> *)&local_90,&local_98);
    DeferCaller::DeferCaller((DeferCaller *)local_70,&local_90);
    std::function<void_()>::~function(&local_90);
    pvVar5 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                       (&this->pollfds_,(size_type)deferCaller.functor_._M_invoker);
    fd_00 = pvVar5->fd;
    pvVar5 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                       (&this->pollfds_,(size_type)deferCaller.functor_._M_invoker);
    uVar1 = pvVar5->revents;
    if ((-1 < fd_00) &&
       (pCVar7 = Poller::getChannel(&this->super_Poller,fd_00), pCVar7 != (Channel *)0x0)) {
      if (((uVar1 & 8) == 0) && ((uVar1 & 0x2000) == 0)) {
        bVar3 = (uVar1 & 1) != 0;
        if (bVar3) {
          Channel::handleReadEvent(pCVar7);
        }
        if (((uVar1 & 4) != 0) &&
           (pCVar7 = Poller::getChannel(&this->super_Poller,fd_00), pCVar7 != (Channel *)0x0)) {
          bVar3 = true;
          Channel::handleWritEvent(pCVar7);
        }
        if (bVar3) {
          i._4_4_ = i._4_4_ + -1;
        }
      }
      else {
        Channel::handleErroEvent(pCVar7);
      }
    }
    DeferCaller::~DeferCaller((DeferCaller *)local_70);
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  return;
}

Assistant:

void PollerPoll::loop_once(Timestamp *ts) {
    runNextLoopHandlers();

    int interMs = -1;
    if (ts != nullptr) {
        Timestamp now = Timestamp::now();
        if (*ts < now) {
            interMs = 0;
        } else {
            interMs = static_cast<int>((*ts - now).toMillSec());
        }
    }

    int nready = ::poll(&pollfds_[0], pollfds_.size(), interMs);

    for (decltype(pollfds_.size()) i = 0; i < pollfds_.size() && nready > 0;
         i++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        bool flag = false;
        int fd = pollfds_[i].fd;
        int revent = pollfds_[i].revents;
        Channel *ch;

        if (fd < 0 || (ch = getChannel(fd)) == nullptr)
            continue;

        if (revent & POLLERR
#ifdef __linux__
            || revent & POLLRDHUP
#endif
            ) {
            flag = true;
            ch->handleErroEvent();
            continue;
        }

        // readEventHandler可能会将ch析构,所以简单的改了一下逻辑
        if (revent & POLLIN) {
            flag = true;
            ch->handleReadEvent();
        }

        if (revent & POLLOUT && (ch = getChannel(fd)) != nullptr) {
            flag = true;
            ch->handleWritEvent();
        }

        if (flag == true) {
            nready--;
        }
    }

    runAfterLoopHandlers();
}